

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedAllocator.cpp
# Opt level: O3

void * btAlignedAllocDefault(size_t size,int alignment)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = (long)alignment;
  pvVar1 = (*sAllocFunc)(size + lVar2 + 7);
  if (pvVar1 == (void *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    pvVar3 = (void *)(-lVar2 & (long)pvVar1 + lVar2 + 7);
    *(void **)((long)pvVar3 + -8) = pvVar1;
  }
  return pvVar3;
}

Assistant:

static inline void *btAlignedAllocDefault(size_t size, int alignment)
{
  void *ret;
  char *real;
  real = (char *)sAllocFunc(size + sizeof(void *) + (alignment-1));
  if (real) {
	ret = btAlignPointer(real + sizeof(void *),alignment);
    *((void **)(ret)-1) = (void *)(real);
  } else {
    ret = (void *)(real);
  }
  return (ret);
}